

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           *this,size_t i,ctrl_t h)

{
  bool bVar1;
  ctrl_t in_DL;
  ulong in_RSI;
  long *in_RDI;
  
  if (in_RSI < (ulong)in_RDI[3]) {
    bVar1 = IsFull(in_DL);
    if (bVar1) {
      SanitizerUnpoisonObject<phmap::priv::map_slot_type<unsigned_long,unsigned_long>>
                ((map_slot_type<unsigned_long,_unsigned_long> *)0x2e4264);
    }
    else {
      SanitizerPoisonObject<phmap::priv::map_slot_type<unsigned_long,unsigned_long>>
                ((map_slot_type<unsigned_long,_unsigned_long> *)0x2e4280);
    }
    *(ctrl_t *)(*in_RDI + in_RSI) = in_DL;
    *(ctrl_t *)(*in_RDI + (in_RSI - 0x10 & in_RDI[3]) + 1 + (in_RDI[3] & 0xfU)) = in_DL;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}